

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O2

ggml_backend_dev_t ggml_backend_dev_by_name(char *name)

{
  bool bVar1;
  size_t sVar2;
  ggml_backend_dev_t pgVar3;
  char *a;
  size_t i;
  ulong index;
  
  index = 0;
  do {
    sVar2 = ggml_backend_dev_count();
    if (sVar2 <= index) {
      return (ggml_backend_dev_t)0x0;
    }
    pgVar3 = ggml_backend_dev_get(index);
    a = (char *)ggml_backend_dev_name(pgVar3);
    bVar1 = striequals(a,name);
    index = index + 1;
  } while (!bVar1);
  return pgVar3;
}

Assistant:

ggml_backend_dev_t ggml_backend_dev_by_name(const char * name) {
    for (size_t i = 0; i < ggml_backend_dev_count(); i++) {
        ggml_backend_dev_t dev = ggml_backend_dev_get(i);
        if (striequals(ggml_backend_dev_name(dev), name)) {
            return dev;
        }
    }
    return nullptr;
}